

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.c
# Opt level: O3

void riff_free(riff *stream)

{
  riff *stream_00;
  uint uVar1;
  riff_chunk *__ptr;
  long lVar2;
  ulong uVar3;
  
  if (stream != (riff *)0x0) {
    __ptr = stream->chunks;
    if (__ptr != (riff_chunk *)0x0) {
      uVar1 = stream->chunk_count;
      if (uVar1 != 0) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          stream_00 = *(riff **)((long)&stream->chunks->type + lVar2);
          if (stream_00 != (riff *)0x0) {
            riff_free(stream_00);
            uVar1 = stream->chunk_count;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < uVar1);
        __ptr = stream->chunks;
      }
      free(__ptr);
    }
    free(stream);
    return;
  }
  return;
}

Assistant:

void riff_free( struct riff * stream )
{
	if ( stream )
	{
		if ( stream->chunks )
		{
			unsigned i;
			for ( i = 0; i < stream->chunk_count; ++i )
			{
				struct riff_chunk * chunk = stream->chunks + i;
                if ( chunk->nested ) riff_free( chunk->nested );
			}
			free( stream->chunks );
		}
		free( stream );
	}
}